

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

void dumpStats(DGLLVMPointerAnalysis *pta)

{
  ulong uVar1;
  bool bVar2;
  PSNodeType PVar3;
  size_type sVar4;
  pointer pPVar5;
  size_t sVar6;
  long lVar7;
  undefined4 uVar8;
  double dVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *node_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *__range1_1;
  size_t accumulated_ptset_size;
  double avg_nonempty_ptset_size;
  double avg_ptset_size;
  PSNodeAlloc *alloc;
  Pointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  PointsToSetT *__range2;
  bool _has_only_valid_targets;
  bool _has_known_size_offset;
  bool _known_offset_only;
  bool _points_to_only_known_size;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *__range1;
  size_t only_valid_and_some_known;
  size_t only_valid_target;
  size_t known_size_known_offset;
  size_t points_to_only_known_size;
  size_t allocation_num;
  size_t has_known_size;
  size_t pointing_to_function;
  size_t pointing_to_stack;
  size_t pointing_to_global;
  size_t pointing_to_heap;
  size_t singleton_nonconst_count;
  size_t singleton_count;
  size_t pointing_only_to_invalidated;
  size_t pointing_to_invalidated;
  size_t pointing_only_to_unknown;
  size_t pointing_to_unknown;
  size_t maximum;
  size_t nonempty_size;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *nodes;
  const_iterator *in_stack_fffffffffffffe38;
  PSNode *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
  local_148;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *local_140;
  ulong local_138;
  double local_130;
  double local_128;
  PSNodeAlloc *local_120;
  Pointer local_118;
  Pointer *local_108;
  pointer local_d0;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  byte local_c1;
  reference local_c0;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *local_b8;
  __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
  local_b0;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  size_t local_20;
  long local_18;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *local_10;
  undefined1 auVar10 [16];
  
  local_10 = dg::DGLLVMPointerAnalysis::getNodes((DGLLVMPointerAnalysis *)0x162eec);
  sVar4 = std::
          vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
          ::size(local_10);
  printf("Pointer subgraph size: %zu\n",sVar4 - 1);
  local_18 = 0;
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = local_10;
  local_b0._M_current =
       (unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
       std::
       vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ::begin((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                *)in_stack_fffffffffffffe38);
  local_b8 = (unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
             std::
             vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ::end((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                    *)in_stack_fffffffffffffe38);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar2) {
      printf("Allocations: %zu\n",local_80);
      printf("Allocations with known size: %zu\n",local_78);
      printf("Nodes with non-empty pt-set: %zu\n",local_18);
      printf("Pointers pointing only to known-size allocations: %zu\n",local_88);
      printf("Pointers pointing only to known-size allocations with known offset: %zu\n",local_90);
      printf("Pointers pointing only to valid targets: %zu\n",local_98);
      printf("Pointers pointing only to valid targets and some known size+offset: %zu\n",local_a0);
      local_128 = 0.0;
      local_130 = 0.0;
      local_138 = 0;
      local_140 = local_10;
      local_148._M_current =
           (unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
           std::
           vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
           ::begin((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                    *)in_stack_fffffffffffffe38);
      std::
      vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
      ::end((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             *)in_stack_fffffffffffffe38);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                                 *)in_stack_fffffffffffffe40,
                                (__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                                 *)in_stack_fffffffffffffe38), bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
        ::operator*(&local_148);
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                           0x163662);
        uVar1 = local_138;
        if (bVar2) {
          std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                    ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x163682)
          ;
          sVar6 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x163691);
          if (-sVar6 - 1 < uVar1) {
            printf("Accumulated points to sets size > 2^64 - 1");
            auVar10._8_4_ = (int)(local_138 >> 0x20);
            auVar10._0_8_ = local_138;
            auVar10._12_4_ = 0x45300000;
            uVar8 = (undefined4)local_138;
            sVar4 = std::
                    vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                    ::size(local_10);
            lVar7 = sVar4 - 1;
            auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar11._0_8_ = lVar7;
            auVar11._12_4_ = 0x45300000;
            local_128 = local_128 +
                        ((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar8) - 4503599627370496.0)) /
                        ((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
            auVar12._8_4_ = (int)(local_138 >> 0x20);
            auVar12._0_8_ = local_138;
            auVar12._12_4_ = 0x45300000;
            auVar16._8_4_ = (int)((ulong)local_18 >> 0x20);
            auVar16._0_8_ = local_18;
            auVar16._12_4_ = 0x45300000;
            local_130 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_138) - 4503599627370496.0)) /
                        ((auVar16._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0)) +
                        local_130;
            local_138 = 0;
          }
          std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                    ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x1637ab)
          ;
          sVar6 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x1637ba);
          local_138 = sVar6 + local_138;
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
        ::operator++(&local_148);
      }
      auVar13._8_4_ = (int)(local_138 >> 0x20);
      auVar13._0_8_ = local_138;
      auVar13._12_4_ = 0x45300000;
      dVar9 = (auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_138) - 4503599627370496.0);
      sVar4 = std::
              vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              ::size(local_10);
      lVar7 = sVar4 - 1;
      auVar14._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar14._0_8_ = lVar7;
      auVar14._12_4_ = 0x45300000;
      local_128 = local_128 +
                  dVar9 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
      auVar15._8_4_ = (int)(local_138 >> 0x20);
      auVar15._0_8_ = local_138;
      auVar15._12_4_ = 0x45300000;
      auVar17._8_4_ = (int)((ulong)local_18 >> 0x20);
      auVar17._0_8_ = local_18;
      auVar17._12_4_ = 0x45300000;
      local_130 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_138) - 4503599627370496.0)) /
                  ((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0)) + local_130;
      printf("Average pt-set size: %6.3f\n",local_128);
      printf("Average non-empty pt-set size: %6.3f\n",local_130);
      printf("Pointing to singleton: %zu\n",local_48);
      printf("Non-constant pointing to singleton: %zu\n",local_50);
      printf("Pointing to unknown: %zu\n",local_28);
      printf("Pointing to unknown singleton: %zu\n",local_30);
      printf("Pointing to invalidated: %zu\n",local_38);
      printf("Pointing to invalidated singleton: %zu\n",local_40);
      printf("Pointing to heap: %zu\n",local_58);
      printf("Pointing to global: %zu\n",local_60);
      printf("Pointing to stack: %zu\n",local_68);
      printf("Pointing to function: %zu\n",local_70);
      printf("Maximum pt-set size: %zu\n",local_20);
      return;
    }
    local_c0 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
               ::operator*(&local_b0);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                       0x163068);
    if (bVar2) {
      std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x16307e);
      bVar2 = dg::pta::PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x16308d);
      if (!bVar2) {
        local_18 = local_18 + 1;
      }
      std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x1630b2);
      sVar6 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x1630c1);
      if (sVar6 == 1) {
        local_48 = local_48 + 1;
        pPVar5 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                           ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                            0x1630e8);
        PVar3 = dg::pta::PSNode::getType(pPVar5);
        if (PVar3 != CONSTANT) {
          pPVar5 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::
                   operator->((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                              0x163102);
          PVar3 = dg::pta::PSNode::getType(pPVar5);
          if (PVar3 != FUNCTION) goto LAB_00163125;
        }
        local_50 = local_50 + 1;
      }
LAB_00163125:
      std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x163132);
      sVar6 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x163141);
      if (local_20 < sVar6) {
        std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                  ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x163158);
        local_20 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x163167);
      }
      local_c1 = 1;
      local_c2 = 1;
      local_c3 = 0;
      local_c4 = 1;
      local_d0 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                           ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                            0x16319c);
      local_d0 = local_d0 + 0xb0;
      dg::pta::PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_fffffffffffffe40);
      dg::pta::PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_fffffffffffffe40);
      while (bVar2 = dg::pta::PointerIdPointsToSet::const_iterator::operator!=
                               ((const_iterator *)in_stack_fffffffffffffe40,
                                in_stack_fffffffffffffe38), bVar2) {
        local_118 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                              (in_stack_fffffffffffffe38);
        local_108 = &local_118;
        bVar2 = dg::Offset::isUnknown(&local_118.offset);
        if (bVar2) {
          local_c2 = 0;
        }
        bVar2 = dg::pta::Pointer::isUnknown(local_108);
        if (bVar2) {
          local_c4 = 0;
          local_28 = local_28 + 1;
          std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                    ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x16327a)
          ;
          sVar6 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x163289);
          if (sVar6 == 1) {
            local_30 = local_30 + 1;
          }
        }
        bVar2 = dg::pta::Pointer::isInvalidated(local_108);
        if (bVar2) {
          local_c4 = 0;
          local_38 = local_38 + 1;
          std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::operator->
                    ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)0x1632e1)
          ;
          sVar6 = dg::pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x1632f0);
          if (sVar6 == 1) {
            local_40 = local_40 + 1;
          }
        }
        bVar2 = dg::pta::Pointer::isNull(local_108);
        if (bVar2) {
          local_c4 = 0;
        }
        local_120 = dg::pta::PSNodeAlloc::get<dg::pta::PSNode>(in_stack_fffffffffffffe40);
        if (local_120 == (PSNodeAlloc *)0x0) {
          local_c1 = 0;
          PVar3 = dg::pta::PSNode::getType(local_108->target);
          if (PVar3 == FUNCTION) {
            local_70 = local_70 + 1;
          }
        }
        else {
          local_80 = local_80 + 1;
          pPVar5 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::
                   operator->((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                              0x16336f);
          sVar6 = dg::SubgraphNode<dg::pta::PSNode>::getSize
                            ((SubgraphNode<dg::pta::PSNode> *)(pPVar5 + 8));
          if (sVar6 == 0) {
LAB_001633d9:
            local_c1 = 0;
          }
          else {
            pPVar5 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::
                     operator->((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>
                                 *)0x16338e);
            sVar6 = dg::SubgraphNode<dg::pta::PSNode>::getSize
                              ((SubgraphNode<dg::pta::PSNode> *)(pPVar5 + 8));
            if (sVar6 == dg::Offset::UNKNOWN) goto LAB_001633d9;
            local_78 = local_78 + 1;
            bVar2 = dg::Offset::isUnknown(&local_108->offset);
            if (!bVar2) {
              local_c3 = 1;
            }
          }
          bVar2 = dg::pta::PSNodeAlloc::isHeap(local_120);
          if (bVar2) {
            local_58 = local_58 + 1;
          }
          else {
            bVar2 = dg::pta::PSNodeAlloc::isGlobal(local_120);
            if (bVar2) {
              local_60 = local_60 + 1;
            }
            else {
              PVar3 = dg::pta::PSNode::getType((PSNode *)local_120);
              if (PVar3 == ALLOC) {
                local_68 = local_68 + 1;
              }
            }
          }
        }
        dg::pta::PointerIdPointsToSet::const_iterator::operator++
                  ((const_iterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
      if (((local_c1 & 1) != 0) && (local_88 = local_88 + 1, (local_c2 & 1) != 0)) {
        local_90 = local_90 + 1;
      }
      if (((local_c4 & 1) != 0) && (local_98 = local_98 + 1, (local_c3 & 1) != 0)) {
        local_a0 = local_a0 + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
    ::operator++(&local_b0);
  } while( true );
}

Assistant:

static void dumpStats(DGLLVMPointerAnalysis *pta) {
    const auto &nodes = pta->getNodes();
    printf("Pointer subgraph size: %zu\n", nodes.size() - 1);

    size_t nonempty_size = 0; // number of nodes with non-empty pt-set
    size_t maximum = 0;       // maximum pt-set size
    size_t pointing_to_unknown = 0;
    size_t pointing_only_to_unknown = 0;
    size_t pointing_to_invalidated = 0;
    size_t pointing_only_to_invalidated = 0;
    size_t singleton_count = 0;
    size_t singleton_nonconst_count = 0;
    size_t pointing_to_heap = 0;
    size_t pointing_to_global = 0;
    size_t pointing_to_stack = 0;
    size_t pointing_to_function = 0;
    size_t has_known_size = 0;
    size_t allocation_num = 0;
    size_t points_to_only_known_size = 0;
    size_t known_size_known_offset = 0;
    size_t only_valid_target = 0;
    size_t only_valid_and_some_known = 0;

    for (const auto &node : nodes) {
        if (!node)
            continue;

        if (!node->pointsTo.empty())
            ++nonempty_size;

        if (node->pointsTo.size() == 1) {
            ++singleton_count;
            if (node->getType() == PSNodeType::CONSTANT ||
                node->getType() == PSNodeType::FUNCTION)
                ++singleton_nonconst_count;
        }

        if (node->pointsTo.size() > maximum)
            maximum = node->pointsTo.size();

        bool _points_to_only_known_size = true;
        bool _known_offset_only = true;
        bool _has_known_size_offset = false;
        bool _has_only_valid_targets = true;
        for (const auto &ptr : node->pointsTo) {
            if (ptr.offset.isUnknown()) {
                _known_offset_only = false;
            }

            if (ptr.isUnknown()) {
                _has_only_valid_targets = false;
                ++pointing_to_unknown;
                if (node->pointsTo.size() == 1)
                    ++pointing_only_to_unknown;
            }

            if (ptr.isInvalidated()) {
                _has_only_valid_targets = false;
                ++pointing_to_invalidated;
                if (node->pointsTo.size() == 1)
                    ++pointing_only_to_invalidated;
            }

            if (ptr.isNull()) {
                _has_only_valid_targets = false;
            }

            auto *alloc = PSNodeAlloc::get(ptr.target);
            if (alloc) {
                ++allocation_num;
                if (node->getSize() != 0 &&
                    node->getSize() != Offset::UNKNOWN) {
                    ++has_known_size;
                    if (!ptr.offset.isUnknown())
                        _has_known_size_offset = true;
                } else
                    _points_to_only_known_size = false;

                if (alloc->isHeap()) {
                    ++pointing_to_heap;
                } else if (alloc->isGlobal()) {
                    ++pointing_to_global;
                } else if (alloc->getType() == PSNodeType::ALLOC) {
                    assert(!alloc->isGlobal());
                    ++pointing_to_stack;
                }
            } else {
                _points_to_only_known_size = false;
                ;

                if (ptr.target->getType() == PSNodeType::FUNCTION) {
                    ++pointing_to_function;
                }
            }
        }

        if (_points_to_only_known_size) {
            ++points_to_only_known_size;
            if (_known_offset_only)
                ++known_size_known_offset;
        }

        if (_has_only_valid_targets) {
            ++only_valid_target;
            if (_has_known_size_offset)
                ++only_valid_and_some_known;
        }
    }

    printf("Allocations: %zu\n", allocation_num);
    printf("Allocations with known size: %zu\n", has_known_size);
    printf("Nodes with non-empty pt-set: %zu\n", nonempty_size);
    printf("Pointers pointing only to known-size allocations: %zu\n",
           points_to_only_known_size);
    printf("Pointers pointing only to known-size allocations with known "
           "offset: %zu\n",
           known_size_known_offset);
    printf("Pointers pointing only to valid targets: %zu\n", only_valid_target);
    printf("Pointers pointing only to valid targets and some known "
           "size+offset: %zu\n",
           only_valid_and_some_known);

    double avg_ptset_size = 0;
    double avg_nonempty_ptset_size = 0; // avg over non-empty sets only
    size_t accumulated_ptset_size = 0;

    for (const auto &node : nodes) {
        if (!node)
            continue;

        if (accumulated_ptset_size > (~((size_t) 0)) - node->pointsTo.size()) {
            printf("Accumulated points to sets size > 2^64 - 1");
            avg_ptset_size += (accumulated_ptset_size /
                               static_cast<double>(nodes.size() - 1));
            avg_nonempty_ptset_size += (accumulated_ptset_size /
                                        static_cast<double>(nonempty_size));
            accumulated_ptset_size = 0;
        }
        accumulated_ptset_size += node->pointsTo.size();
    }

    avg_ptset_size +=
            (accumulated_ptset_size / static_cast<double>(nodes.size() - 1));
    avg_nonempty_ptset_size +=
            (accumulated_ptset_size / static_cast<double>(nonempty_size));
    printf("Average pt-set size: %6.3f\n", avg_ptset_size);
    printf("Average non-empty pt-set size: %6.3f\n", avg_nonempty_ptset_size);
    printf("Pointing to singleton: %zu\n", singleton_count);
    printf("Non-constant pointing to singleton: %zu\n",
           singleton_nonconst_count);
    printf("Pointing to unknown: %zu\n", pointing_to_unknown);
    printf("Pointing to unknown singleton: %zu\n", pointing_only_to_unknown);
    printf("Pointing to invalidated: %zu\n", pointing_to_invalidated);
    printf("Pointing to invalidated singleton: %zu\n",
           pointing_only_to_invalidated);
    printf("Pointing to heap: %zu\n", pointing_to_heap);
    printf("Pointing to global: %zu\n", pointing_to_global);
    printf("Pointing to stack: %zu\n", pointing_to_stack);
    printf("Pointing to function: %zu\n", pointing_to_function);
    printf("Maximum pt-set size: %zu\n", maximum);
}